

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semver.hpp
# Opt level: O0

from_chars_result __thiscall
semver::detail::version_parser::parse_build_identifier(version_parser *this,string *out)

{
  char __c;
  bool bVar1;
  char *pcVar2;
  byte *pbVar3;
  undefined8 extraout_RDX;
  size_t k;
  char *ptr;
  string *this_00;
  from_chars_result fVar4;
  bool local_a1;
  uchar digit;
  undefined8 local_58;
  token token;
  string result;
  string *out_local;
  version_parser *this_local;
  errc local_10;
  
  this_00 = out;
  std::__cxx11::string::string((string *)&token.lexeme);
  local_58 = token_stream::advance((token *)this->stream,(token_stream *)this_00);
  token._0_8_ = extraout_RDX;
  do {
    if ((token_type)local_58 == hyphen) {
      Catch::clara::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
      ::push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&token.lexeme
                  ,'-');
    }
    else if ((token_type)local_58 == letter) {
      pcVar2 = std::get<char,_std::monostate,_unsigned_char,_char,_semver::detail::range_operator>
                         ((variant<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>
                           *)((long)&local_58 + 1));
      Catch::clara::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
      ::push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&token.lexeme
                  ,*pcVar2);
    }
    else {
      if ((token_type)local_58 != digit) {
        fVar4 = failure((char *)token._0_8_,invalid_argument);
        this_local = (version_parser *)fVar4.super_from_chars_result.ptr;
        local_10 = fVar4.super_from_chars_result.ec;
        goto LAB_001db043;
      }
      pbVar3 = std::
               get<unsigned_char,_std::monostate,_unsigned_char,_char,_semver::detail::range_operator>
                         ((variant<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>
                           *)((long)&local_58 + 1));
      __c = to_char((uint)*pbVar3);
      Catch::clara::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
      ::push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&token.lexeme
                  ,__c);
    }
    bVar1 = token_stream::advanceIfMatch(this->stream,(token *)&local_58,hyphen);
    local_a1 = true;
    if (!bVar1) {
      bVar1 = token_stream::advanceIfMatch(this->stream,(token *)&local_58,letter);
      local_a1 = true;
      if (!bVar1) {
        local_a1 = token_stream::advanceIfMatch(this->stream,(token *)&local_58,digit);
      }
    }
  } while (local_a1 != false);
  Catch::clara::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
  operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)out,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&token.lexeme);
  token_stream::peek((token *)this->stream,(token_stream *)0x0,k);
  fVar4 = success(ptr);
  this_local = (version_parser *)fVar4.super_from_chars_result.ptr;
  local_10 = fVar4.super_from_chars_result.ec;
LAB_001db043:
  std::__cxx11::string::~string((string *)&token.lexeme);
  fVar4.super_from_chars_result.ec = local_10;
  fVar4.super_from_chars_result.ptr = (char *)this_local;
  fVar4.super_from_chars_result._12_4_ = 0;
  return (from_chars_result)fVar4.super_from_chars_result;
}

Assistant:

parse_build_identifier(std::string& out) {
    std::string result;
    token token = stream.advance();

    do {
      switch (token.type) {
      case token_type::hyphen:
        result.push_back('-');
        break;
      case token_type::letter:
        result.push_back(std::get<char>(token.value));
        break;
      case token_type::digit:
      {
        const auto digit = std::get<std::uint8_t>(token.value);
        result.push_back(to_char(digit));
        break;
      }
      default:
        return failure(token.lexeme);
      }
    } while (stream.advanceIfMatch(token, token_type::hyphen) || stream.advanceIfMatch(token, token_type::letter) || stream.advanceIfMatch(token, token_type::digit));

    out = result;
    return success(stream.peek().lexeme);
  }